

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O0

vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
optimization::common_expr_del::BlockNodes::cast_operands_abi_cxx11_
          (BlockNodes *this,vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *value)

{
  bool bVar1;
  reference __s;
  char *pcVar2;
  VarId *__k;
  mapped_type *pmVar3;
  int __c;
  BlockNodes *in_RDX;
  Value *in_RSI;
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  mapped_type nodeId;
  VarId var;
  Value val;
  iterator __end2;
  iterator __begin2;
  vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *__range2;
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *operands;
  Value *in_stack_fffffffffffffe78;
  BlockNodes *in_stack_fffffffffffffe80;
  map<mir::inst::VarId,_optimization::common_expr_del::NodeId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
  *in_stack_fffffffffffffec0;
  undefined1 local_110 [192];
  variant<int,_mir::inst::VarId> local_50;
  Value *local_38;
  __normal_iterator<mir::inst::Value_*,_std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>_>
  local_30 [2];
  undefined1 local_19;
  
  local_19 = 0;
  std::
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x16996b);
  local_30[0]._M_current =
       (Value *)std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::begin
                          (in_stack_fffffffffffffe78);
  local_38 = (Value *)std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::end
                                ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                                 in_stack_fffffffffffffe78);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<mir::inst::Value_*,_std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>_>
                             *)in_stack_fffffffffffffe80,
                            (__normal_iterator<mir::inst::Value_*,_std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>_>
                             *)in_stack_fffffffffffffe78), bVar1) {
    __s = __gnu_cxx::
          __normal_iterator<mir::inst::Value_*,_std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>_>
          ::operator*(local_30);
    mir::inst::Value::Value((Value *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    pcVar2 = std::variant<int,_mir::inst::VarId>::index(&local_50,(char *)__s,__c);
    if (pcVar2 == (char *)0x0) {
      std::get<int,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x169a07);
      in_stack_fffffffffffffec0 =
           (map<mir::inst::VarId,_optimization::common_expr_del::NodeId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
            *)(local_110 + 0x80);
      std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>::
      variant<int&,void,void,int,void>
                ((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffe80,(int *)in_stack_fffffffffffffe78);
      std::
      vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back((vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffe80,(value_type *)in_stack_fffffffffffffe78);
      std::
      variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x169a43);
    }
    else {
      __k = std::get<mir::inst::VarId,int,mir::inst::VarId>
                      ((variant<int,_mir::inst::VarId> *)0x169a94);
      mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffffe80,(VarId *)in_stack_fffffffffffffe78)
      ;
      mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffffe80,(VarId *)in_stack_fffffffffffffe78)
      ;
      bVar1 = query_var(in_stack_fffffffffffffe80,(VarId *)in_stack_fffffffffffffe78);
      if (!bVar1) {
        mir::inst::VarId::VarId
                  ((VarId *)in_stack_fffffffffffffe80,(VarId *)in_stack_fffffffffffffe78);
        mir::inst::Value::Value
                  ((Value *)in_stack_fffffffffffffe80,(VarId *)in_stack_fffffffffffffe78);
        local_110._44_4_ = add_leaf_node(in_RDX,in_RSI);
      }
      pmVar3 = std::
               map<mir::inst::VarId,_optimization::common_expr_del::NodeId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
               ::operator[](in_stack_fffffffffffffec0,__k);
      local_110._40_4_ = pmVar3->id;
      in_stack_fffffffffffffe80 = (BlockNodes *)local_110;
      std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>::
      variant<optimization::common_expr_del::NodeId&,void,void,optimization::common_expr_del::NodeId,void>
                ((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffe80,(NodeId *)in_stack_fffffffffffffe78);
      std::
      vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back((vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffe80,(value_type *)in_stack_fffffffffffffe78);
      std::
      variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~variant((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x169b96);
    }
    __gnu_cxx::
    __normal_iterator<mir::inst::Value_*,_std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>_>
    ::operator++(local_30);
  }
  return in_RDI;
}

Assistant:

std::vector<Operand> cast_operands(std::vector<mir::inst::Value> value) {
    std::vector<Operand> operands;
    for (auto val : value) {
      if (val.index() == 0) {
        operands.push_back(std::get<int>(val));
      } else {
        auto var = std::get<mir::inst::VarId>(val);
        if (!query_var(var)) {
          add_leaf_node(var);
        }
        auto nodeId = var_map[var];
        operands.push_back(nodeId);
      }
    }
    return operands;
  }